

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O0

void trico_fill_code(uint8_t **out,uint32_t *xor1,uint32_t *xor2,uint32_t *bcode)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint local_30;
  uint32_t k;
  uint32_t bc;
  uint32_t *bcode_local;
  uint32_t *xor2_local;
  uint32_t *xor1_local;
  uint8_t **out_local;
  
  uVar3 = bcode[7] << 0x15 | bcode[6] << 0x12 | bcode[5] << 0xf | bcode[4] << 0xc | bcode[3] << 9 |
          bcode[2] << 6 | bcode[1] << 3 | *bcode;
  puVar2 = *out;
  *out = puVar2 + 1;
  *puVar2 = (uint8_t)(uVar3 >> 0x10);
  puVar2 = *out;
  *out = puVar2 + 1;
  *puVar2 = (uint8_t)(uVar3 >> 8);
  puVar2 = *out;
  *out = puVar2 + 1;
  *puVar2 = (uint8_t)uVar3;
  for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
    switch(bcode[local_30]) {
    case 0:
      break;
    case 1:
      uVar1 = xor1[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)uVar1;
      break;
    case 2:
      uVar1 = xor1[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor1[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)uVar1;
      break;
    case 3:
      uVar1 = xor1[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor1[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor1[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)uVar1;
      break;
    case 4:
      uVar1 = xor1[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)(uVar1 >> 0x18);
      uVar1 = xor1[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor1[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor1[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)uVar1;
      break;
    case 5:
      uVar1 = xor2[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)uVar1;
      break;
    case 6:
      uVar1 = xor2[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor2[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)uVar1;
      break;
    case 7:
      uVar1 = xor2[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor2[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor2[local_30];
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = (uint8_t)uVar1;
    }
  }
  return;
}

Assistant:

static inline void trico_fill_code(uint8_t** out, uint32_t* xor1, uint32_t* xor2, uint32_t* bcode)
  {
  uint32_t bc = (bcode[7] << 21) | (bcode[6] << 18) | (bcode[5] << 15) | (bcode[4] << 12) | (bcode[3] << 9) | (bcode[2] << 6) | (bcode[1] << 3) | bcode[0];

  *(*out)++ = (uint8_t)(bc >> 16);
  *(*out)++ = (uint8_t)((bc >> 8) & 0xff);
  *(*out)++ = (uint8_t)(bc & 0xff);

  for (uint32_t k = 0; k < 8; ++k)
    {
    switch (bcode[k])
      {
      case 0:
      {
      break;
      }
      case 1:
      {
      *(*out)++ = (uint8_t)(xor1[k]);
      break;
      }
      case 2:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 3:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 16));
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 4:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 24));
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 5:
      {
      *(*out)++ = (uint8_t)(xor2[k]);
      break;
      }
      case 6:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 7:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 16));
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      }
    }
  }